

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O3

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:2184:27)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  ostringstream *this;
  undefined8 uVar1;
  OutputWorker *this_00;
  Result flushResult;
  type handler;
  undefined1 local_1e0 [8];
  undefined1 local_1d8 [24];
  char local_1c0 [16];
  ptr local_1b0;
  undefined1 local_198 [392];
  
  local_1b0.h = (type *)local_1d8;
  local_1d8._0_8_ = base[1].next_;
  local_1b0.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:2184:27)>
                 *)base;
  local_1b0.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:2184:27)>
                 *)base;
  ptr::reset(&local_1b0);
  uVar1 = local_1d8._0_8_;
  if (owner != (void *)0x0) {
    tonk::SessionOutgoing::Flush((SessionOutgoing *)local_1e0);
    if (local_1e0 != (undefined1  [8])0x0) {
      tonk::Result::ToJson_abi_cxx11_((string *)(local_1d8 + 8),(Result *)local_1e0);
      if ((int)*(Level *)(uVar1 + 0x118) < 5) {
        local_198._0_8_ = ((Channel *)(uVar1 + 0x110))->ChannelName;
        this = (ostringstream *)(local_198 + 0x10);
        local_198._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(((string *)(uVar1 + 0x148))->_M_dataplus)._M_p,
                   (long)((scheduler_operation *)(uVar1 + 0x150))->next_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"tonk_flush failed: ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(char *)local_1d8._8_8_,local_1d8._16_8_);
        this_00 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_00,(LogStringBuffer *)local_198);
        std::__cxx11::ostringstream::~ostringstream(this);
        std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
      }
      if ((char *)local_1d8._8_8_ != local_1c0) {
        operator_delete((void *)local_1d8._8_8_);
      }
      tonk::RefCounter::StartShutdown((RefCounter *)(uVar1 + 8),2,(Result *)local_1e0);
    }
    LOCK();
    *(int *)&((scheduler_operation *)(uVar1 + 0x30))->next_ =
         *(int *)&((scheduler_operation *)(uVar1 + 0x30))->next_ + -1;
    UNLOCK();
    tonk::Result::~Result((Result *)local_1e0);
  }
  ptr::reset(&local_1b0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }